

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O3

string * __thiscall
KeyValueFile::trimStr(string *__return_storage_ptr__,KeyValueFile *this,string *s)

{
  char cVar1;
  uint uVar2;
  pointer pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  
  uVar2 = (uint)s->_M_string_length;
  uVar5 = (ulong)uVar2;
  uVar4 = uVar2 - 1;
  if ((int)uVar2 < 2) {
LAB_00122c11:
    if ((int)uVar5 < 1) goto LAB_00122c32;
  }
  else {
    uVar5 = (ulong)uVar4 + 1;
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar5 - 1];
      if ((cVar1 != ' ') && (cVar1 != '\t')) {
        uVar4 = (int)uVar5 - 1;
        goto LAB_00122c11;
      }
      uVar5 = uVar5 - 1;
    } while (1 < (long)uVar5);
    uVar5 = 1;
    uVar4 = 0;
  }
  pcVar3 = (s->_M_dataplus)._M_p;
  uVar6 = 0;
  do {
    cVar1 = pcVar3[uVar6];
    if ((cVar1 != ' ') && (cVar1 != '\t')) {
      pcVar8 = pcVar3 + (uVar6 & 0xffffffff);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = pcVar8 + (long)(int)(uVar4 - (int)uVar6) + 1;
      goto LAB_00122c62;
    }
    uVar6 = uVar6 + 1;
  } while ((uVar5 & 0xffffffff) != uVar6);
LAB_00122c32:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar7 = "";
  pcVar8 = "";
LAB_00122c62:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

std::string trimStr(std::string s)
  {
    int from = 0;
    int to = int(s.length()) - 1;
    while (to > 0 && isSpace(s[to]))
      to--;
    while (from <= to && isSpace(s[from]))
      from++;
    if (to < from)
      return std::string("");
    return std::string(&(s[from]), to - from + 1);
  }